

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BVH.cpp
# Opt level: O0

double SimpleBVH::anon_unknown_6::point_box_signed_squared_distance
                 (VectorMax3d *p,array<Eigen::Matrix<double,__1,_1,_0,_3,_1>,_2UL> *B)

{
  double dVar1;
  bool bVar2;
  Index IVar3;
  EigenBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_> *this;
  Index IVar4;
  CoeffReturnType pdVar5;
  DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>,_0> *pDVar6;
  __type _Var7;
  int local_2c;
  double dStack_28;
  int c;
  double result;
  bool inside;
  array<Eigen::Matrix<double,__1,_1,_0,_3,_1>,_2UL> *B_local;
  VectorMax3d *p_local;
  
  IVar3 = Eigen::EigenBase<Eigen::Matrix<double,_-1,_1,_0,_3,_1>_>::size
                    ((EigenBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_> *)p);
  this = (EigenBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_> *)
         std::array<Eigen::Matrix<double,_-1,_1,_0,_3,_1>,_2UL>::operator[](B,0);
  IVar4 = Eigen::EigenBase<Eigen::Matrix<double,_-1,_1,_0,_3,_1>_>::size(this);
  if (IVar3 != IVar4) {
    __assert_fail("p.size() == B[0].size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/geometryprocessing[P]SimpleBVH/src/SimpleBVH/BVH.cpp"
                  ,0x9f,
                  "double SimpleBVH::(anonymous namespace)::point_box_signed_squared_distance(const VectorMax3d &, const std::array<VectorMax3d, 2> &)"
                 );
  }
  bVar2 = true;
  dStack_28 = 0.0;
  for (local_2c = 0;
      IVar3 = Eigen::EigenBase<Eigen::Matrix<double,_-1,_1,_0,_3,_1>_>::size
                        ((EigenBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>_> *)p), local_2c < IVar3;
      local_2c = local_2c + 1) {
    pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_3,_1>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>,_0> *)p,
                        (long)local_2c);
    dVar1 = *pdVar5;
    pDVar6 = (DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>,_0> *)
             std::array<Eigen::Matrix<double,_-1,_1,_0,_3,_1>,_2UL>::operator[](B,0);
    pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_3,_1>,_0>::operator[]
                       (pDVar6,(long)local_2c);
    if (*pdVar5 <= dVar1) {
      pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_3,_1>,_0>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>,_0> *)p,
                          (long)local_2c);
      dVar1 = *pdVar5;
      pDVar6 = (DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>,_0> *)
               std::array<Eigen::Matrix<double,_-1,_1,_0,_3,_1>,_2UL>::operator[](B,1);
      pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_3,_1>,_0>::operator[]
                         (pDVar6,(long)local_2c);
      if (*pdVar5 <= dVar1 && dVar1 != *pdVar5) {
        bVar2 = false;
        pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_3,_1>,_0>::operator[]
                           ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>,_0> *)p,
                            (long)local_2c);
        dVar1 = *pdVar5;
        pDVar6 = (DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>,_0> *)
                 std::array<Eigen::Matrix<double,_-1,_1,_0,_3,_1>,_2UL>::operator[](B,1);
        pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_3,_1>,_0>::operator[]
                           (pDVar6,(long)local_2c);
        _Var7 = std::pow<double,int>(dVar1 - *pdVar5,2);
        dStack_28 = _Var7 + dStack_28;
      }
    }
    else {
      bVar2 = false;
      pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_3,_1>,_0>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>,_0> *)p,
                          (long)local_2c);
      dVar1 = *pdVar5;
      pDVar6 = (DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,_3,_1>,_0> *)
               std::array<Eigen::Matrix<double,_-1,_1,_0,_3,_1>,_2UL>::operator[](B,0);
      pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_3,_1>,_0>::operator[]
                         (pDVar6,(long)local_2c);
      _Var7 = std::pow<double,int>(dVar1 - *pdVar5,2);
      dStack_28 = _Var7 + dStack_28;
    }
  }
  if (bVar2) {
    dStack_28 = inner_point_box_squared_distance(p,B);
    dStack_28 = -dStack_28;
  }
  return dStack_28;
}

Assistant:

double point_box_signed_squared_distance(
        const VectorMax3d& p, const std::array<VectorMax3d, 2>& B)
    {
        assert(p.size() == B[0].size());

        bool inside = true;
        double result = 0.0;
        for (int c = 0; c < p.size(); c++) {
            if (p[c] < B[0][c]) {
                inside = false;
                result += std::pow(p[c] - B[0][c], 2);
            } else if (p[c] > B[1][c]) {
                inside = false;
                result += std::pow(p[c] - B[1][c], 2);
            }
        }
        if (inside) {
            result = -inner_point_box_squared_distance(p, B);
        }
        return result;
    }